

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O0

void __thiscall
iutest::detail::ExpressionLHS<unsigned_int>::ExpressionLHS
          (ExpressionLHS<unsigned_int> *this,uint *lhs)

{
  uint *lhs_local;
  ExpressionLHS<unsigned_int> *this_local;
  
  this->m_lhs = *lhs;
  std::__cxx11::string::string((string *)&this->m_message);
  AppendMessage<unsigned_int>(this,&this->m_lhs);
  return;
}

Assistant:

explicit ExpressionLHS(T&& lhs) : m_lhs( ::std::forward<T>(lhs) )
    {
        AppendMessage(m_lhs);
    }